

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_ods.c
# Opt level: O0

int rf_set_pa(rf_dev_t *dev,uint8_t level,_Bool pa1_on)

{
  byte local_1b;
  byte local_19;
  uint8_t val;
  _Bool pa1_on_local;
  uint8_t level_local;
  rf_dev_t *dev_local;
  
  local_19 = level;
  if (pa1_on) {
    local_1b = 0x40;
    if (0x1f < level) {
      local_1b = 0x60;
      local_19 = level - 4;
    }
  }
  else {
    local_1b = 0x80;
  }
  if (local_19 < 0x20) {
    dev_local._4_4_ = spi_write_reg(dev->fd,'\x11',local_1b | local_19);
  }
  else {
    dev_local._4_4_ = 2;
  }
  return dev_local._4_4_;
}

Assistant:

int rf_set_pa(rf_dev_t *dev, uint8_t level, bool pa1_on)
{
	uint8_t val = 0;
	if (pa1_on) {
		val |= 0x40;
		if (level > 0x1f) {
			val |= 0x20;
			level -= 4;
		}
	} else {
		val |= 0x80;
	}

	if (level > 0x1f) {
		return ERR_INVAL;
	}

	val |= level;

	return spi_write_reg(dev->fd, RegPaLevel, val);
}